

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<std::pair<int,int>>::emplace<std::pair<int,int>const&>
          (QPodArrayOps<std::pair<int,_int>_> *this,qsizetype i,pair<int,_int> *args)

{
  long lVar1;
  pair<int,_int> pVar2;
  bool bVar3;
  qsizetype qVar4;
  pair<int,_int> *ppVar5;
  pair<int,_int> *in_RDX;
  QArrayDataPointer<std::pair<int,_int>_> *in_RSI;
  QArrayDataPointer<std::pair<int,_int>_> *in_RDI;
  long in_FS_OFFSET;
  pair<int,_int> *where;
  GrowthPosition pos;
  bool detach;
  pair<int,_int> tmp;
  QArrayDataPointer<std::pair<int,_int>_> *in_stack_ffffffffffffffc8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QArrayDataPointer<std::pair<int,_int>_>::needsDetach(in_RDI);
  uVar7 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffd4);
  if (!bVar3) {
    if ((in_RSI == (QArrayDataPointer<std::pair<int,_int>_> *)in_RDI->size) &&
       (qVar4 = QArrayDataPointer<std::pair<int,_int>_>::freeSpaceAtEnd(in_stack_ffffffffffffffc8),
       qVar4 != 0)) {
      ppVar5 = QArrayDataPointer<std::pair<int,_int>_>::end(in_RDI);
      *ppVar5 = *in_RDX;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0090cb4a;
    }
    if ((in_RSI == (QArrayDataPointer<std::pair<int,_int>_> *)0x0) &&
       (qVar4 = QArrayDataPointer<std::pair<int,_int>_>::freeSpaceAtBegin(in_stack_ffffffffffffffc8)
       , qVar4 != 0)) {
      ppVar5 = QArrayDataPointer<std::pair<int,_int>_>::begin
                         ((QArrayDataPointer<std::pair<int,_int>_> *)0x90ca95);
      ppVar5[-1] = *in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0090cb4a;
    }
  }
  pVar2 = *in_RDX;
  uVar6 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<std::pair<int,_int>_> *)0x0)) {
    uVar6 = 1;
  }
  QArrayDataPointer<std::pair<int,_int>_>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar7,uVar6),
             (pair<int,_int> **)in_stack_ffffffffffffffc8,in_RDI);
  ppVar5 = QPodArrayOps<std::pair<int,_int>_>::createHole
                     ((QPodArrayOps<std::pair<int,_int>_> *)in_RSI,
                      (GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar7,uVar6),
                      (qsizetype)in_stack_ffffffffffffffc8);
  *ppVar5 = pVar2;
LAB_0090cb4a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }